

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O1

void __thiscall
Assimp::AC3DImporter::ConvertMaterial
          (AC3DImporter *this,Object *object,Material *matSrc,aiMaterial *matDest)

{
  float fVar1;
  ulong uVar2;
  float f;
  int n;
  aiString s;
  float local_44c;
  aiVector2D local_448;
  aiVector2D aStack_440;
  undefined4 local_438;
  aiString local_434;
  
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  uVar2 = (matSrc->name)._M_string_length;
  if (uVar2 != 0) {
    if (uVar2 < 0x400) {
      local_434.length = (ai_uint32)uVar2;
      memcpy(local_434.data,(matSrc->name)._M_dataplus._M_p,uVar2);
      local_434.data[uVar2] = '\0';
    }
    aiMaterial::AddProperty(matDest,&local_434,"?mat.name",0,0);
  }
  uVar2 = (object->texture)._M_string_length;
  if (uVar2 != 0) {
    if (uVar2 < 0x400) {
      local_434.length = (ai_uint32)uVar2;
      memcpy(local_434.data,(object->texture)._M_dataplus._M_p,uVar2);
      local_434.data[uVar2] = '\0';
    }
    aiMaterial::AddProperty(matDest,&local_434,"$tex.file",1,0);
    fVar1 = (object->texRepeat).x;
    if (((((fVar1 != 1.0) || (NAN(fVar1))) || (fVar1 = (object->texRepeat).y, fVar1 != 1.0)) ||
        ((NAN(fVar1) || (fVar1 = (object->texOffset).x, fVar1 != 0.0)))) ||
       ((NAN(fVar1) || ((fVar1 = (object->texOffset).y, fVar1 != 0.0 || (NAN(fVar1))))))) {
      local_438 = 0;
      aStack_440 = object->texRepeat;
      local_448 = object->texOffset;
      aiMaterial::AddBinaryProperty(matDest,&local_448,0x14,"$tex.uvtrafo",1,0,aiPTI_Float);
    }
  }
  aiMaterial::AddBinaryProperty(matDest,matSrc,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(matDest,&matSrc->amb,0xc,"$clr.ambient",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(matDest,&matSrc->emis,0xc,"$clr.emissive",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(matDest,&matSrc->spec,0xc,"$clr.specular",0,0,aiPTI_Float);
  if ((matSrc->shin != 0.0) || (NAN(matSrc->shin))) {
    local_448.x = 4.2039e-45;
    aiMaterial::AddBinaryProperty(matDest,&matSrc->shin,4,"$mat.shininess",0,0,aiPTI_Float);
  }
  else {
    local_448.x = 2.8026e-45;
  }
  aiMaterial::AddBinaryProperty(matDest,&local_448,4,"$mat.shadingm",0,0,aiPTI_Integer);
  local_44c = 1.0 - matSrc->trans;
  aiMaterial::AddBinaryProperty(matDest,&local_44c,4,"$mat.opacity",0,0,aiPTI_Float);
  return;
}

Assistant:

void AC3DImporter::ConvertMaterial(const Object& object,
    const Material& matSrc,
    aiMaterial& matDest)
{
    aiString s;

    if (matSrc.name.length())
    {
        s.Set(matSrc.name);
        matDest.AddProperty(&s,AI_MATKEY_NAME);
    }
    if (object.texture.length())
    {
        s.Set(object.texture);
        matDest.AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // UV transformation
        if (1.f != object.texRepeat.x || 1.f != object.texRepeat.y ||
            object.texOffset.x        || object.texOffset.y)
        {
            aiUVTransform transform;
            transform.mScaling = object.texRepeat;
            transform.mTranslation = object.texOffset;
            matDest.AddProperty(&transform,1,AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
        }
    }

    matDest.AddProperty<aiColor3D>(&matSrc.rgb,1, AI_MATKEY_COLOR_DIFFUSE);
    matDest.AddProperty<aiColor3D>(&matSrc.amb,1, AI_MATKEY_COLOR_AMBIENT);
    matDest.AddProperty<aiColor3D>(&matSrc.emis,1,AI_MATKEY_COLOR_EMISSIVE);
    matDest.AddProperty<aiColor3D>(&matSrc.spec,1,AI_MATKEY_COLOR_SPECULAR);

    int n;
    if (matSrc.shin)
    {
        n = aiShadingMode_Phong;
        matDest.AddProperty<float>(&matSrc.shin,1,AI_MATKEY_SHININESS);
    }
    else n = aiShadingMode_Gouraud;
    matDest.AddProperty<int>(&n,1,AI_MATKEY_SHADING_MODEL);

    float f = 1.f - matSrc.trans;
    matDest.AddProperty<float>(&f,1,AI_MATKEY_OPACITY);
}